

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

bool __thiscall miniros::Subscription::pubUpdate(Subscription *this,V_string *new_pubs)

{
  Level LVar1;
  void *pvVar2;
  bool bVar3;
  element_type *this_00;
  string *psVar4;
  ostream *poVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined8 uVar8;
  Subscription *in_RSI;
  long in_RDI;
  bool enabled_3;
  string *uri;
  iterator __end1_1;
  iterator __begin1_1;
  V_string *__range1_1;
  bool enabled_2;
  bool enabled_1;
  PublisherLinkPtr *link;
  iterator __end1;
  iterator __begin1;
  V_PublisherLink *__range1;
  PendingConnectionPtr *conn_1;
  iterator __end4;
  iterator __begin4;
  S_PendingConnection *__range4;
  scoped_lock<std::mutex> lock_3;
  iterator spc_1;
  bool found_1;
  const_iterator up_i_2;
  const_iterator up_i_1;
  bool found;
  iterator spc;
  scoped_lock<std::mutex> lock_2;
  V_PublisherLink to_add;
  V_PublisherLink subtractions;
  V_string additions;
  bool enabled;
  PendingConnectionPtr *conn;
  iterator __end2_2;
  iterator __begin2_2;
  S_PendingConnection *__range2_2;
  scoped_lock<std::mutex> lock_1;
  PublisherLinkPtr *plink;
  iterator __end2_1;
  iterator __begin2_1;
  V_PublisherLink *__range2_1;
  scoped_lock<std::mutex> lock;
  string *up_i;
  const_iterator __end2;
  const_iterator __begin2;
  V_string *__range2;
  stringstream ss;
  string ownURI;
  bool retval;
  scoped_lock<std::mutex> slock;
  char *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  value_type *in_stack_fffffffffffffa88;
  LogLocation *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  Level in_stack_fffffffffffffab0;
  uint in_stack_fffffffffffffab4;
  uint uVar9;
  char *in_stack_fffffffffffffab8;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  string *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  bool local_4a2;
  bool local_491;
  allocator<char> local_411;
  string local_410 [32];
  reference local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  allocator<char> local_3a1;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  local_370;
  undefined1 *local_368;
  reference local_360;
  _Self local_358;
  _Self local_350;
  long local_348;
  shared_ptr<miniros::PublisherLink> *local_338;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  local_330;
  byte local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  byte local_2f9;
  shared_ptr<miniros::PublisherLink> *local_2f8;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  local_2f0 [5];
  undefined1 local_2c8 [48];
  string local_298 [38];
  undefined1 local_272;
  allocator<char> local_271;
  string local_270 [32];
  reference local_250;
  _Self local_248;
  _Self local_240;
  long local_238;
  reference local_228;
  shared_ptr<miniros::PublisherLink> *local_220;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  local_218;
  long local_210;
  reference local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0 [2];
  stringstream local_1e0 [16];
  ostream local_1d0 [392];
  string local_48 [35];
  byte local_25;
  undefined4 local_24;
  string *in_stack_ffffffffffffffe0;
  bool local_1;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa80,
             (mutex_type *)in_stack_fffffffffffffa78);
  if (((*(byte *)(in_RDI + 0xe5) & 1) == 0) && ((*(byte *)(in_RDI + 0xe4) & 1) == 0)) {
    local_25 = 1;
    RPCManager::instance();
    this_00 = std::
              __shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4d0919);
    psVar4 = RPCManager::getServerURI_abi_cxx11_(this_00);
    std::__cxx11::string::string(local_48,(string *)psVar4);
    std::__cxx11::stringstream::stringstream(local_1e0);
    local_1f0[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa78);
    local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa78);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa80,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa78), bVar3) {
      local_200 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(local_1f0);
      poVar5 = std::operator<<(local_1d0,(string *)local_200);
      std::operator<<(poVar5,", ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(local_1f0);
    }
    std::operator<<(local_1d0," already have these connections: ");
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa80,
               (mutex_type *)in_stack_fffffffffffffa78);
    local_210 = in_RDI + 0x168;
    local_218._M_current =
         (shared_ptr<miniros::PublisherLink> *)
         std::
         vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                  *)in_stack_fffffffffffffa78);
    local_220 = (shared_ptr<miniros::PublisherLink> *)
                std::
                vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                       *)in_stack_fffffffffffffa78);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                               *)in_stack_fffffffffffffa80,
                              (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                               *)in_stack_fffffffffffffa78), bVar3) {
      local_228 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                  ::operator*(&local_218);
      peVar7 = std::
               __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4d0b13);
      psVar4 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(peVar7);
      poVar5 = std::operator<<(local_1d0,(string *)psVar4);
      std::operator<<(poVar5,", ");
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
      ::operator++(&local_218);
    }
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d0ba1);
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa80,
               (mutex_type *)in_stack_fffffffffffffa78);
    local_238 = in_RDI + 0x110;
    local_240._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
         ::begin((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
                  *)in_stack_fffffffffffffa78);
    local_248._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
         ::end((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
                *)in_stack_fffffffffffffa78);
    while (bVar3 = std::operator!=(&local_240,&local_248), bVar3) {
      local_250 = std::
                  _Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>
                  ::operator*((_Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>
                               *)in_stack_fffffffffffffa80);
      peVar6 = std::
               __shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4d0c4f);
      psVar4 = PendingConnection::getRemoteURI_abi_cxx11_(peVar6);
      poVar5 = std::operator<<(local_1d0,(string *)psVar4);
      std::operator<<(poVar5,", ");
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>::
      operator++((_Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>
                  *)in_stack_fffffffffffffa80);
    }
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d0cdd);
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((pubUpdate::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffab8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
      console::initializeLogLocation
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 in_stack_fffffffffffffaa8,(Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator(&local_271);
    }
    if (pubUpdate::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffa80,
                 (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
    }
    pvVar2 = pubUpdate::loc.logger_;
    LVar1 = pubUpdate::loc.level_;
    local_272 = (pubUpdate::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_272) {
      in_stack_fffffffffffffa80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      in_stack_fffffffffffffa88 = (value_type *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffa78 = "Publisher update for [%s]: %s";
      console::print((FilterBase *)0x0,pvVar2,(Level)(ulong)LVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0xf8,"bool miniros::Subscription::pubUpdate(const V_string &)");
      std::__cxx11::string::~string(local_298);
    }
    std::__cxx11::stringstream::~stringstream(local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4d0f1c);
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
              *)0x4d0f29);
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
              *)0x4d0f36);
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa80,
               (mutex_type *)in_stack_fffffffffffffa78);
    local_2f0[0]._M_current =
         (shared_ptr<miniros::PublisherLink> *)
         std::
         vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                  *)in_stack_fffffffffffffa78);
    while( true ) {
      local_2f8 = (shared_ptr<miniros::PublisherLink> *)
                  std::
                  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                  ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                         *)in_stack_fffffffffffffa78);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                          *)in_stack_fffffffffffffa80,
                         (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                          *)in_stack_fffffffffffffa78);
      if (!bVar3) break;
      local_2f9 = 0;
      local_308._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa78);
      while( true ) {
        local_491 = false;
        if ((local_2f9 & 1) == 0) {
          local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffa78);
          local_491 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffffa80,
                                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffffa78);
        }
        if (local_491 == false) goto LAB_004d10d7;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
        ::operator*(local_2f0);
        peVar7 = std::
                 __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4d1030);
        PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(peVar7);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_308);
        bVar3 = urisEqual(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        if (bVar3) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_308);
      }
      local_2f9 = 1;
LAB_004d10d7:
      if ((local_2f9 & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
        ::operator*(local_2f0);
        std::
        vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
        ::push_back((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                     *)in_stack_fffffffffffffa90,(value_type *)in_stack_fffffffffffffa88);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
      ::operator++(local_2f0);
    }
    local_318._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa78);
    while( true ) {
      local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa78);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa80,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa78);
      if (!bVar3) break;
      local_321 = 0;
      local_330._M_current =
           (shared_ptr<miniros::PublisherLink> *)
           std::
           vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
           ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                    *)in_stack_fffffffffffffa78);
      while( true ) {
        local_4a2 = false;
        if ((local_321 & 1) == 0) {
          local_338 = (shared_ptr<miniros::PublisherLink> *)
                      std::
                      vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                      ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                             *)in_stack_fffffffffffffa78);
          local_4a2 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                                  *)in_stack_fffffffffffffa80,
                                 (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                                  *)in_stack_fffffffffffffa78);
        }
        if (local_4a2 == false) goto LAB_004d1262;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_318);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
        ::operator*(&local_330);
        peVar7 = std::
                 __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4d1207);
        PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(peVar7);
        bVar3 = urisEqual(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        if (bVar3) break;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
        ::operator++(&local_330);
      }
      local_321 = 1;
LAB_004d1262:
      if ((local_321 & 1) == 0) {
        std::scoped_lock<std::mutex>::scoped_lock
                  ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa80,
                   (mutex_type *)in_stack_fffffffffffffa78);
        local_348 = in_RDI + 0x110;
        local_350._M_node =
             (_Base_ptr)
             std::
             set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
             ::begin((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
                      *)in_stack_fffffffffffffa78);
        local_358._M_node =
             (_Base_ptr)
             std::
             set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
             ::end((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
                    *)in_stack_fffffffffffffa78);
        while (bVar3 = std::operator!=(&local_350,&local_358), bVar3) {
          local_360 = std::
                      _Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>
                      ::operator*((_Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>
                                   *)in_stack_fffffffffffffa80);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_318);
          peVar6 = std::
                   __shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4d1323);
          PendingConnection::getRemoteURI_abi_cxx11_(peVar6);
          bVar3 = urisEqual(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
          if (bVar3) {
            local_321 = 1;
            break;
          }
          std::_Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>::
          operator++((_Rb_tree_const_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>
                      *)in_stack_fffffffffffffa80);
        }
        std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d13b1);
      }
      if ((local_321 & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_318);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_318);
    }
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d13fd);
    local_368 = local_2c8;
    local_370._M_current =
         (shared_ptr<miniros::PublisherLink> *)
         std::
         vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                  *)in_stack_fffffffffffffa78);
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
           *)in_stack_fffffffffffffa78);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                               *)in_stack_fffffffffffffa80,
                              (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                               *)in_stack_fffffffffffffa78), bVar3) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
      ::operator*(&local_370);
      peVar7 = std::
               __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4d1477);
      PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(peVar7);
      bVar3 = std::operator!=(in_stack_fffffffffffffa80,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa78);
      if (bVar3) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
                     in_stack_fffffffffffffab8,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     in_stack_fffffffffffffaa8,(Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc60);
          std::allocator<char>::~allocator(&local_3a1);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    ((LogLocation *)in_stack_fffffffffffffa80,
                     (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
        }
        pvVar2 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                 ::loc.logger_;
        LVar1 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::loc.level_;
        if ((pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::loc.logger_enabled_ & 1U) != 0) {
          peVar7 = std::
                   __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4d1629);
          PublisherLink::getCallerID_abi_cxx11_(peVar7);
          in_stack_fffffffffffffa80 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::c_str();
          uVar8 = std::__cxx11::string::c_str();
          peVar7 = std::
                   __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4d1670);
          PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(peVar7);
          in_stack_fffffffffffffa90 = (LogLocation *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffa78 = "Disconnecting from publisher [%s] of topic [%s] at [%s]";
          console::print((FilterBase *)0x0,pvVar2,(Level)(ulong)LVar1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x13d,"bool miniros::Subscription::pubUpdate(const V_string &)",
                         "Disconnecting from publisher [%s] of topic [%s] at [%s]",
                         in_stack_fffffffffffffa80,uVar8);
        }
        peVar7 = std::
                 __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4d16f0);
        (*peVar7->_vptr_PublisherLink[5])();
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
                     in_stack_fffffffffffffab8,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     in_stack_fffffffffffffaa8,(Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc37);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    ((LogLocation *)in_stack_fffffffffffffa80,
                     (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
        }
        pvVar2 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                 ::loc.logger_;
        LVar1 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::loc.level_;
        if ((pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::loc.logger_enabled_ & 1U) != 0) {
          in_stack_fffffffffffffa80 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::c_str();
          in_stack_fffffffffffffa78 = "Disconnect: skipping myself for topic [%s]";
          console::print((FilterBase *)0x0,pvVar2,(Level)(ulong)LVar1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x142,"bool miniros::Subscription::pubUpdate(const V_string &)");
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
      ::operator++(&local_370);
    }
    local_3e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa78);
    local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa78);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa80,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa78), bVar3) {
      local_3f0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_3e0);
      bVar3 = std::operator!=(in_stack_fffffffffffffa80,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa78);
      if (bVar3) {
        in_stack_fffffffffffffac7 = negotiateConnection(in_RSI,in_stack_ffffffffffffffe0);
        local_25 = (local_25 & 1 & in_stack_fffffffffffffac7) != 0;
      }
      else {
        uVar9 = in_stack_fffffffffffffab4;
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
          uVar9 = in_stack_fffffffffffffab4;
        }
        if (((pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.initialized_ ^ 0xffU) & 1) != 0) {
          __s = &local_411;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),(char *)__s,
                     (allocator<char> *)CONCAT44(uVar9,in_stack_fffffffffffffab0));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT44(uVar9,in_stack_fffffffffffffab0),
                     in_stack_fffffffffffffaa8,(Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          std::__cxx11::string::~string(local_410);
          std::allocator<char>::~allocator(&local_411);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    ((LogLocation *)in_stack_fffffffffffffa80,
                     (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
        }
        in_stack_fffffffffffffab4 = uVar9 & 0xffffff;
        if ((pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::loc.logger_enabled_ & 1U) != 0) {
          in_stack_fffffffffffffab4 = CONCAT13(1,(int3)uVar9);
        }
        if ((char)(in_stack_fffffffffffffab4 >> 0x18) != '\0') {
          in_stack_fffffffffffffaa8 =
               (string *)
               pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
               ::loc.logger_;
          in_stack_fffffffffffffab0 =
               pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
               ::loc.level_;
          in_stack_fffffffffffffa80 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::c_str();
          uVar8 = std::__cxx11::string::c_str();
          in_stack_fffffffffffffa78 = "Skipping myself (%s, %s)";
          in_stack_fffffffffffffaa0 = in_stack_fffffffffffffa80;
          console::print((FilterBase *)0x0,in_stack_fffffffffffffaa8,
                         (Level)(ulong)in_stack_fffffffffffffab0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x14f,"bool miniros::Subscription::pubUpdate(const V_string &)",
                         "Skipping myself (%s, %s)",in_stack_fffffffffffffa80,uVar8);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3e0);
    }
    local_1 = (bool)(local_25 & 1);
    local_24 = 1;
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               *)in_stack_fffffffffffffa90);
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               *)in_stack_fffffffffffffa90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string(local_48);
  }
  else {
    local_1 = false;
    local_24 = 1;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d1bea);
  return local_1;
}

Assistant:

bool Subscription::pubUpdate(const V_string& new_pubs)
{
  std::scoped_lock<std::mutex> slock(shutdown_mutex_);

  if (shutting_down_ || dropped_)
  {
    return false;
  }

  bool retval = true;

  const std::string ownURI = RPCManager::instance()->getServerURI();
  {
    std::stringstream ss;

    for (const std::string& up_i: new_pubs)
      ss << up_i << ", ";

    ss << " already have these connections: ";
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      for (PublisherLinkPtr& plink: publisher_links_)
        ss << plink->getPublisherXMLRPCURI() << ", ";
    }

    {
      std::scoped_lock<std::mutex> lock(pending_connections_mutex_);
      for (const PendingConnectionPtr& conn: pending_connections_)
        ss << conn->getRemoteURI() << ", ";
    }

    MINIROS_DEBUG("Publisher update for [%s]: %s", name_.c_str(), ss.str().c_str());
  }

  V_string additions;
  V_PublisherLink subtractions;
  V_PublisherLink to_add;
  // could use the STL set operations... but these sets are so small
  // it doesn't really matter.
  {
    std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

    for (V_PublisherLink::iterator spc = publisher_links_.begin();
         spc!= publisher_links_.end(); ++spc)
    {
      bool found = false;
      for (V_string::const_iterator up_i = new_pubs.begin();
           !found && up_i != new_pubs.end(); ++up_i)
      {
        if (urisEqual((*spc)->getPublisherXMLRPCURI(), *up_i))
        {
          found = true;
          break;
        }
      }

      if (!found)
      {
        subtractions.push_back(*spc);
      }
    }

    for (V_string::const_iterator up_i  = new_pubs.begin(); up_i != new_pubs.end(); ++up_i)
    {
      bool found = false;
      for (V_PublisherLink::iterator spc = publisher_links_.begin();
           !found && spc != publisher_links_.end(); ++spc)
      {
        if (urisEqual(*up_i, (*spc)->getPublisherXMLRPCURI()))
        {
          found = true;
          break;
        }
      }

      if (!found)
      {
        std::scoped_lock<std::mutex> lock(pending_connections_mutex_);
        for (const PendingConnectionPtr& conn: pending_connections_)
        {
          if (urisEqual(*up_i, conn->getRemoteURI()))
          {
            found = true;
            break;
          }
        }
      }

      if (!found)
      {
        additions.push_back(*up_i);
      }
    }
  }

  for (const PublisherLinkPtr& link: subtractions)
  {
    if (link->getPublisherXMLRPCURI() != ownURI)
    {
      MINIROS_DEBUG("Disconnecting from publisher [%s] of topic [%s] at [%s]",
                  link->getCallerID().c_str(), name_.c_str(), link->getPublisherXMLRPCURI().c_str());
      link->drop();
    }
    else
    {
      MINIROS_DEBUG("Disconnect: skipping myself for topic [%s]", name_.c_str());
    }
  }

  for (const std::string& uri: additions)
  {
    // this function should never negotiate a self-subscription
    if (ownURI != uri)
    {
      retval &= negotiateConnection(uri);
    }
    else
    {
      MINIROS_DEBUG("Skipping myself (%s, %s)", name_.c_str(), ownURI.c_str());
    }
  }

  return retval;
}